

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase555::run(TestCase555 *this)

{
  SourceLocation location;
  bool bVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  nfds_t __nfds;
  nfds_t __nfds_00;
  pollfd *ppVar5;
  bool local_12d9;
  DebugExpression<bool_&> DStack_12d8;
  bool _kj_shouldLog_1;
  DebugExpression<bool_&> _kjCondition_1;
  Fault f_2;
  SyscallResult local_12ac;
  undefined1 local_12a8 [4];
  SyscallResult _kjSyscallResult_2;
  char buffer [4096];
  bool local_29c;
  bool local_29b;
  DebugExpression<bool> local_29a [2];
  undefined1 auStack_298 [4];
  bool _kj_shouldLog;
  DebugExpression<bool> _kjCondition;
  char *pcStack_290;
  char *local_288;
  undefined1 local_278 [16];
  Promise<void> local_268;
  Promise<void> promise;
  bool writable;
  Fault f_1;
  SyscallResult local_23c;
  undefined1 auStack_238 [4];
  SyscallResult _kjSyscallResult_1;
  ssize_t n;
  FdObserver observer;
  OwnFd outfd;
  OwnFd infd;
  Fault f;
  SyscallResult local_1bc;
  undefined1 auStack_1b8 [4];
  SyscallResult _kjSyscallResult;
  int pipefds [2];
  WaitScope waitScope;
  undefined1 local_180 [8];
  EventLoop loop;
  UnixEventPort port;
  TestCase555 *this_local;
  
  captureSignals();
  UnixEventPort::UnixEventPort((UnixEventPort *)&loop.currentlyFiring);
  EventLoop::EventLoop((EventLoop *)local_180,(EventPort *)&loop.currentlyFiring);
  WaitScope::WaitScope((WaitScope *)pipefds,(EventLoop *)local_180);
  _auStack_1b8 = (char *)0x0;
  f.exception = (Exception *)auStack_1b8;
  local_1bc = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase555::run()::__0>
                        ((anon_class_8_1_619ab5e7 *)&f,false);
  pvVar4 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_1bc);
  if (pvVar4 == (void *)0x0) {
    iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_1bc);
    kj::_::Debug::Fault::Fault
              ((Fault *)&outfd,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x232,iVar2,"pipe(pipefds)","");
    kj::_::Debug::Fault::fatal((Fault *)&outfd);
  }
  OwnFd::OwnFd((OwnFd *)&observer.field_0x54,(int)auStack_1b8);
  OwnFd::OwnFd((OwnFd *)&observer.atEnd,_kjSyscallResult.errorNumber);
  iVar2 = OwnFd::operator_cast_to_int((OwnFd *)&observer.atEnd);
  setNonblocking(iVar2);
  iVar2 = OwnFd::operator_cast_to_int((OwnFd *)&observer.field_0x54);
  setNonblocking(iVar2);
  iVar2 = OwnFd::operator_cast_to_int((OwnFd *)&observer.atEnd);
  UnixEventPort::FdObserver::FdObserver
            ((FdObserver *)&n,(UnixEventPort *)&loop.currentlyFiring,iVar2,2);
  do {
    f_1.exception = (Exception *)auStack_238;
    local_23c = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase555::run()::__1>
                          ((anon_class_16_2_8f6e5347 *)&f_1,true);
    pvVar4 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_23c);
    if (pvVar4 == (void *)0x0) {
      iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_23c);
      kj::_::Debug::Fault::Fault
                ((Fault *)&stack0xfffffffffffffda8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x23c,iVar2,"n = write(outfd, \"foo\", 3)","");
      kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffda8);
    }
  } while (-1 < (long)_auStack_238);
  promise.super_PromiseBase.node.ptr._7_1_ = 0;
  UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_278);
  Promise<void>::then<kj::(anonymous_namespace)::TestCase555::run()::__2>
            ((Promise<void> *)(local_278 + 8),(Type *)local_278);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_298,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
             ,"run",0x240,0x12);
  location.function = pcStack_290;
  location.fileName = _auStack_298;
  location._16_8_ = local_288;
  Promise<void>::eagerlyEvaluate(&local_268,local_278 + 8,location);
  Promise<void>::~Promise((Promise<void> *)(local_278 + 8));
  Promise<void>::~Promise((Promise<void> *)local_278);
  uVar3 = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&kj::maxValue);
  ppVar5 = (pollfd *)(ulong)uVar3;
  EventLoop::run((EventLoop *)local_180,uVar3);
  UnixEventPort::poll((UnixEventPort *)&loop.currentlyFiring,ppVar5,__nfds,(int)local_288);
  uVar3 = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&kj::maxValue);
  EventLoop::run((EventLoop *)local_180,uVar3);
  local_29b = (bool)(~promise.super_PromiseBase.node.ptr._7_1_ & 1);
  local_29a[0] = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_29b);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)local_29a);
  if (!bVar1) {
    local_29c = kj::_::Debug::shouldLog(ERROR);
    while (local_29c != false) {
      local_288 = "\"failed: expected \" \"!(writable)\", _kjCondition";
      kj::_::Debug::log<char_const(&)[29],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x247,ERROR,"\"failed: expected \" \"!(writable)\", _kjCondition",
                 (char (*) [29])"failed: expected !(writable)",local_29a);
      local_29c = false;
    }
  }
  memset(local_12a8,0,0x1000);
  do {
    f_2.exception = (Exception *)auStack_238;
    local_12ac = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase555::run()::__3>
                           ((anon_class_24_3_eca8b9b4 *)&f_2,true);
    pvVar4 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_12ac);
    iVar2 = (int)local_288;
    if (pvVar4 == (void *)0x0) {
      iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_12ac);
      kj::_::Debug::Fault::Fault
                ((Fault *)&_kjCondition_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x24f,iVar2,"n = read(infd, &buffer, sizeof(buffer))","");
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1);
    }
  } while (0 < (long)_auStack_238);
  uVar3 = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&kj::maxValue);
  ppVar5 = (pollfd *)(ulong)uVar3;
  EventLoop::run((EventLoop *)local_180,uVar3);
  UnixEventPort::poll((UnixEventPort *)&loop.currentlyFiring,ppVar5,__nfds_00,iVar2);
  uVar3 = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&kj::maxValue);
  EventLoop::run((EventLoop *)local_180,uVar3);
  DStack_12d8 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (bool *)((long)&promise.super_PromiseBase.node.ptr + 7));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&stack0xffffffffffffed28)
  ;
  if (!bVar1) {
    local_12d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_12d9 != false) {
      kj::_::Debug::log<char_const(&)[26],kj::_::DebugExpression<bool&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x256,ERROR,"\"failed: expected \" \"writable\", _kjCondition",
                 (char (*) [26])"failed: expected writable",&stack0xffffffffffffed28);
      local_12d9 = false;
    }
  }
  Promise<void>::~Promise(&local_268);
  UnixEventPort::FdObserver::~FdObserver((FdObserver *)&n);
  OwnFd::~OwnFd((OwnFd *)&observer.atEnd);
  OwnFd::~OwnFd((OwnFd *)&observer.field_0x54);
  WaitScope::~WaitScope((WaitScope *)pipefds);
  EventLoop::~EventLoop((EventLoop *)local_180);
  UnixEventPort::~UnixEventPort((UnixEventPort *)&loop.currentlyFiring);
  return;
}

Assistant:

TEST(AsyncUnixTest, WriteObserver) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  int pipefds[2]{};
  KJ_SYSCALL(pipe(pipefds));
  kj::OwnFd infd(pipefds[0]), outfd(pipefds[1]);
  setNonblocking(outfd);
  setNonblocking(infd);

  UnixEventPort::FdObserver observer(port, outfd, UnixEventPort::FdObserver::OBSERVE_WRITE);

  // Fill buffer.
  ssize_t n;
  do {
    KJ_NONBLOCKING_SYSCALL(n = write(outfd, "foo", 3));
  } while (n >= 0);

  bool writable = false;
  auto promise = observer.whenBecomesWritable()
      .then([&]() { writable = true; }).eagerlyEvaluate(nullptr);

  loop.run();
  port.poll();
  loop.run();

  EXPECT_FALSE(writable);

  // Empty the read end so that the write end becomes writable. Note that Linux implements a
  // high watermark / low watermark heuristic which means that only reading one byte is not
  // sufficient. The amount we have to read is in fact architecture-dependent -- it appears to be
  // 1 page. To be safe, we read everything.
  char buffer[4096]{};
  do {
    KJ_NONBLOCKING_SYSCALL(n = read(infd, &buffer, sizeof(buffer)));
  } while (n > 0);

  loop.run();
  port.poll();
  loop.run();

  EXPECT_TRUE(writable);
}